

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QColorDialogPrivate::newHsv(QColorDialogPrivate *this,int h,int s,int v)

{
  if ((this->super_QDialogPrivate).nativeDialogInUse != false) {
    return;
  }
  QtPrivate::QColorShower::setHsv(this->cs,h,s,v);
  QtPrivate::QColorPicker::setCol(this->cp,h,s);
  QtPrivate::QColorLuminancePicker::setCol(this->lp,h,s,v);
  return;
}

Assistant:

void QColorDialogPrivate::newHsv(int h, int s, int v)
{
    if (!nativeDialogInUse) {
        cs->setHsv(h, s, v);
        cp->setCol(h, s);
        lp->setCol(h, s, v);
    }
}